

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopObj.c
# Opt level: O0

Hop_Obj_t * Hop_ObjCreatePo(Hop_Man_t *p,Hop_Obj_t *pDriver)

{
  int iVar1;
  uint uVar2;
  Hop_Obj_t *Entry;
  Hop_Obj_t *pHVar3;
  Hop_Obj_t *pObj;
  Hop_Obj_t *pDriver_local;
  Hop_Man_t *p_local;
  
  Entry = Hop_ManFetchMemory(p);
  *(uint *)&Entry->field_0x20 = *(uint *)&Entry->field_0x20 & 0xfffffff8 | 3;
  Vec_PtrPush(p->vPos,Entry);
  Entry->pFanin0 = pDriver;
  if (p->fRefCount == 0) {
    pHVar3 = Hop_Regular(pDriver);
    iVar1 = Hop_ObjLevel(pHVar3);
    *(uint *)&Entry->field_0x20 = *(uint *)&Entry->field_0x20 & 0x3f | iVar1 << 6;
  }
  else {
    pHVar3 = Hop_Regular(pDriver);
    Hop_ObjRef(pHVar3);
  }
  uVar2 = Hop_ObjPhaseCompl(pDriver);
  *(uint *)&Entry->field_0x20 = *(uint *)&Entry->field_0x20 & 0xfffffff7 | (uVar2 & 1) << 3;
  p->nObjs[3] = p->nObjs[3] + 1;
  return Entry;
}

Assistant:

Hop_Obj_t * Hop_ObjCreatePo( Hop_Man_t * p, Hop_Obj_t * pDriver )
{
    Hop_Obj_t * pObj;
    pObj = Hop_ManFetchMemory( p );
    pObj->Type = AIG_PO;
    Vec_PtrPush( p->vPos, pObj );
    // add connections
    pObj->pFanin0 = pDriver;
    if ( p->fRefCount )
        Hop_ObjRef( Hop_Regular(pDriver) );
    else
        pObj->nRefs = Hop_ObjLevel( Hop_Regular(pDriver) );
    // set the phase
    pObj->fPhase = Hop_ObjPhaseCompl(pDriver);
    // update node counters of the manager
    p->nObjs[AIG_PO]++;
    return pObj;
}